

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

void FastPForLib::Simple16<true>::unpack1_28(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *puVar1 >> 0x1b & 1;
  puVar2[1] = *puVar1 >> 0x1a & 1;
  puVar2[2] = *puVar1 >> 0x19 & 1;
  puVar2[3] = *puVar1 >> 0x18 & 1;
  puVar2[4] = *puVar1 >> 0x17 & 1;
  puVar2[5] = *puVar1 >> 0x16 & 1;
  puVar2[6] = *puVar1 >> 0x15 & 1;
  puVar2[7] = *puVar1 >> 0x14 & 1;
  puVar2[8] = *puVar1 >> 0x13 & 1;
  puVar2[9] = *puVar1 >> 0x12 & 1;
  puVar2[10] = *puVar1 >> 0x11 & 1;
  puVar2[0xb] = *puVar1 >> 0x10 & 1;
  puVar2[0xc] = *puVar1 >> 0xf & 1;
  puVar2[0xd] = *puVar1 >> 0xe & 1;
  puVar2[0xe] = *puVar1 >> 0xd & 1;
  puVar2[0xf] = *puVar1 >> 0xc & 1;
  puVar2[0x10] = *puVar1 >> 0xb & 1;
  puVar2[0x11] = *puVar1 >> 10 & 1;
  puVar2[0x12] = *puVar1 >> 9 & 1;
  puVar2[0x13] = *puVar1 >> 8 & 1;
  puVar2[0x14] = *puVar1 >> 7 & 1;
  puVar2[0x15] = *puVar1 >> 6 & 1;
  puVar2[0x16] = *puVar1 >> 5 & 1;
  puVar2[0x17] = *puVar1 >> 4 & 1;
  puVar2[0x18] = *puVar1 >> 3 & 1;
  puVar2[0x19] = *puVar1 >> 2 & 1;
  puVar2[0x1a] = *puVar1 >> 1 & 1;
  puVar2[0x1b] = *puVar1 & 1;
  *in = puVar1 + 1;
  *out = puVar2 + 0x1c;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack1_28(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 27) & 0x01;
  pout[1] = (pin[0] >> 26) & 0x01;
  pout[2] = (pin[0] >> 25) & 0x01;
  pout[3] = (pin[0] >> 24) & 0x01;
  pout[4] = (pin[0] >> 23) & 0x01;
  pout[5] = (pin[0] >> 22) & 0x01;
  pout[6] = (pin[0] >> 21) & 0x01;
  pout[7] = (pin[0] >> 20) & 0x01;
  pout[8] = (pin[0] >> 19) & 0x01;
  pout[9] = (pin[0] >> 18) & 0x01;
  pout[10] = (pin[0] >> 17) & 0x01;
  pout[11] = (pin[0] >> 16) & 0x01;
  pout[12] = (pin[0] >> 15) & 0x01;
  pout[13] = (pin[0] >> 14) & 0x01;
  pout[14] = (pin[0] >> 13) & 0x01;
  pout[15] = (pin[0] >> 12) & 0x01;
  pout[16] = (pin[0] >> 11) & 0x01;
  pout[17] = (pin[0] >> 10) & 0x01;
  pout[18] = (pin[0] >> 9) & 0x01;
  pout[19] = (pin[0] >> 8) & 0x01;
  pout[20] = (pin[0] >> 7) & 0x01;
  pout[21] = (pin[0] >> 6) & 0x01;
  pout[22] = (pin[0] >> 5) & 0x01;
  pout[23] = (pin[0] >> 4) & 0x01;
  pout[24] = (pin[0] >> 3) & 0x01;
  pout[25] = (pin[0] >> 2) & 0x01;
  pout[26] = (pin[0] >> 1) & 0x01;
  pout[27] = pin[0] & 0x01;

  *in = pin + 1;
  *out = pout + 28;
}